

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O2

string * currentDateTime_abi_cxx11_(void)

{
  tm *ptVar1;
  string *in_RDI;
  allocator<char> local_b1;
  time_t now;
  tm tstruct;
  char buf [80];
  
  now = time((time_t *)0x0);
  ptVar1 = localtime(&now);
  tstruct.tm_sec = ptVar1->tm_sec;
  tstruct.tm_min = ptVar1->tm_min;
  tstruct.tm_hour = ptVar1->tm_hour;
  tstruct.tm_mday = ptVar1->tm_mday;
  tstruct.tm_mon = ptVar1->tm_mon;
  tstruct.tm_year = ptVar1->tm_year;
  tstruct.tm_wday = ptVar1->tm_wday;
  tstruct.tm_yday = ptVar1->tm_yday;
  tstruct.tm_isdst = ptVar1->tm_isdst;
  tstruct._36_4_ = *(undefined4 *)&ptVar1->field_0x24;
  tstruct.tm_gmtoff = ptVar1->tm_gmtoff;
  tstruct.tm_zone = ptVar1->tm_zone;
  strftime(buf,0x50,"%Y-%m-%d.%X",(tm *)&tstruct);
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,buf,&local_b1);
  return in_RDI;
}

Assistant:

string currentDateTime() {
    time_t     now = time(0);
    struct tm  tstruct;
    char       buf[80];
    tstruct = *localtime(&now);
    strftime(buf, sizeof(buf), "%Y-%m-%d.%X", &tstruct);
    return buf;
}